

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# missing_deps.cc
# Opt level: O3

void __thiscall
MissingDependencyScanner::ProcessNodeDeps
          (MissingDependencyScanner *this,Node *node,Node **dep_nodes,int dep_nodes_count)

{
  _Rb_tree_header *p_Var1;
  Node *pNVar2;
  Edge *to;
  bool bVar3;
  int iVar4;
  _Rb_tree_node_base *p_Var5;
  iterator iVar6;
  Node **__v;
  iterator ne;
  ulong uVar7;
  Edge **ppEVar8;
  Edge *deplog_edge;
  set<Edge_*,_std::less<Edge_*>,_std::allocator<Edge_*>_> deplog_edges;
  Edge **local_d8;
  iterator iStack_d0;
  Edge **local_c8;
  int local_bc;
  ulong local_b8;
  Node **local_b0;
  Node *local_a8;
  Edge *local_a0;
  Rule *local_98;
  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::_Identity<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_90;
  _Rb_tree<Edge_*,_Edge_*,_std::_Identity<Edge_*>,_std::less<Edge_*>,_std::allocator<Edge_*>_>
  local_60;
  
  local_60._M_impl.super__Rb_tree_header._M_header._M_left =
       &local_60._M_impl.super__Rb_tree_header._M_header;
  local_60._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  local_60._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  local_60._M_impl.super__Rb_tree_header._M_node_count = 0;
  local_b0 = dep_nodes;
  local_a8 = node;
  local_60._M_impl.super__Rb_tree_header._M_header._M_right =
       local_60._M_impl.super__Rb_tree_header._M_header._M_left;
  if (0 < dep_nodes_count) {
    local_b8 = (ulong)(uint)dep_nodes_count;
    uVar7 = 0;
    local_bc = dep_nodes_count;
    local_a0 = node->in_edge_;
    do {
      pNVar2 = local_b0[uVar7];
      iVar4 = std::__cxx11::string::compare((char *)pNVar2);
      if (iVar4 == 0) goto LAB_0011c314;
      local_90._M_impl._0_8_ = pNVar2->in_edge_;
      if ((Edge *)local_90._M_impl._0_8_ != (Edge *)0x0) {
        std::_Rb_tree<Edge*,Edge*,std::_Identity<Edge*>,std::less<Edge*>,std::allocator<Edge*>>::
        _M_insert_unique<Edge*const&>
                  ((_Rb_tree<Edge*,Edge*,std::_Identity<Edge*>,std::less<Edge*>,std::allocator<Edge*>>
                    *)&local_60,(Edge **)&local_90);
      }
      to = local_a0;
      uVar7 = uVar7 + 1;
    } while (local_b8 != uVar7);
    local_d8 = (Edge **)0x0;
    iStack_d0._M_current = (Edge **)0x0;
    local_c8 = (Edge **)0x0;
    p_Var1 = &local_60._M_impl.super__Rb_tree_header;
    p_Var5 = local_60._M_impl.super__Rb_tree_header._M_header._M_left;
    if ((_Rb_tree_header *)local_60._M_impl.super__Rb_tree_header._M_header._M_left != p_Var1) {
      do {
        bVar3 = PathExistsBetween(this,*(Edge **)(p_Var5 + 1),to);
        if (!bVar3) {
          if (iStack_d0._M_current == local_c8) {
            std::vector<Edge*,std::allocator<Edge*>>::_M_realloc_insert<Edge*const&>
                      ((vector<Edge*,std::allocator<Edge*>> *)&local_d8,iStack_d0,
                       (Edge **)(p_Var5 + 1));
          }
          else {
            *iStack_d0._M_current = *(Edge **)(p_Var5 + 1);
            iStack_d0._M_current = iStack_d0._M_current + 1;
          }
        }
        p_Var5 = (_Rb_tree_node_base *)std::_Rb_tree_increment(p_Var5);
      } while ((_Rb_tree_header *)p_Var5 != p_Var1);
      if (local_d8 != iStack_d0._M_current) {
        local_90._M_impl.super__Rb_tree_header._M_header._M_left =
             &local_90._M_impl.super__Rb_tree_header._M_header;
        local_90._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
        local_90._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
        local_90._M_impl.super__Rb_tree_header._M_node_count = 0;
        iVar6._M_current = iStack_d0._M_current;
        ppEVar8 = local_d8;
        local_90._M_impl.super__Rb_tree_header._M_header._M_right =
             local_90._M_impl.super__Rb_tree_header._M_header._M_left;
        do {
          __v = local_b0;
          uVar7 = local_b8;
          if (0 < local_bc) {
            do {
              if ((*__v)->in_edge_ == *ppEVar8) {
                std::
                _Rb_tree<Node*,Node*,std::_Identity<Node*>,std::less<Node*>,std::allocator<Node*>>::
                _M_insert_unique<Node*const&>
                          ((_Rb_tree<Node*,Node*,std::_Identity<Node*>,std::less<Node*>,std::allocator<Node*>>
                            *)&this->generated_nodes_,__v);
                local_98 = (*ppEVar8)->rule_;
                std::
                _Rb_tree<Rule_const*,Rule_const*,std::_Identity<Rule_const*>,std::less<Rule_const*>,std::allocator<Rule_const*>>
                ::_M_insert_unique<Rule_const*>
                          ((_Rb_tree<Rule_const*,Rule_const*,std::_Identity<Rule_const*>,std::less<Rule_const*>,std::allocator<Rule_const*>>
                            *)&this->generator_rules_,&local_98);
                std::
                _Rb_tree<std::__cxx11::string,std::__cxx11::string,std::_Identity<std::__cxx11::string>,std::less<std::__cxx11::string>,std::allocator<std::__cxx11::string>>
                ::_M_insert_unique<std::__cxx11::string_const&>
                          ((_Rb_tree<std::__cxx11::string,std::__cxx11::string,std::_Identity<std::__cxx11::string>,std::less<std::__cxx11::string>,std::allocator<std::__cxx11::string>>
                            *)&local_90,&(*ppEVar8)->rule_->name_);
                (*this->delegate_->_vptr_MissingDependencyScannerDelegate[2])
                          (this->delegate_,local_a8,*__v,(*ppEVar8)->rule_);
              }
              __v = __v + 1;
              uVar7 = uVar7 - 1;
              iVar6._M_current = iStack_d0._M_current;
            } while (uVar7 != 0);
          }
          ppEVar8 = ppEVar8 + 1;
        } while (ppEVar8 != iVar6._M_current);
        this->missing_dep_path_count_ =
             this->missing_dep_path_count_ +
             (int)local_90._M_impl.super__Rb_tree_header._M_node_count;
        std::_Rb_tree<Node*,Node*,std::_Identity<Node*>,std::less<Node*>,std::allocator<Node*>>::
        _M_insert_unique<Node*const&>
                  ((_Rb_tree<Node*,Node*,std::_Identity<Node*>,std::less<Node*>,std::allocator<Node*>>
                    *)&this->nodes_missing_deps_,&local_a8);
        std::
        _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::_Identity<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ::~_Rb_tree(&local_90);
      }
      if (local_d8 != (Edge **)0x0) {
        operator_delete(local_d8,(long)local_c8 - (long)local_d8);
      }
    }
  }
LAB_0011c314:
  std::_Rb_tree<Edge_*,_Edge_*,_std::_Identity<Edge_*>,_std::less<Edge_*>,_std::allocator<Edge_*>_>
  ::~_Rb_tree(&local_60);
  return;
}

Assistant:

void MissingDependencyScanner::ProcessNodeDeps(Node* node, Node** dep_nodes,
                                               int dep_nodes_count) {
  Edge* edge = node->in_edge();
  std::set<Edge*> deplog_edges;
  for (int i = 0; i < dep_nodes_count; ++i) {
    Node* deplog_node = dep_nodes[i];
    // Special exception: A dep on build.ninja can be used to mean "always
    // rebuild this target when the build is reconfigured", but build.ninja is
    // often generated by a configuration tool like cmake or gn. The rest of
    // the build "implicitly" depends on the entire build being reconfigured,
    // so a missing dep path to build.ninja is not an actual missing dependency
    // problem.
    if (deplog_node->path() == "build.ninja")
      return;
    Edge* deplog_edge = deplog_node->in_edge();
    if (deplog_edge) {
      deplog_edges.insert(deplog_edge);
    }
  }
  std::vector<Edge*> missing_deps;
  for (std::set<Edge*>::iterator de = deplog_edges.begin();
       de != deplog_edges.end(); ++de) {
    if (!PathExistsBetween(*de, edge)) {
      missing_deps.push_back(*de);
    }
  }

  if (!missing_deps.empty()) {
    std::set<std::string> missing_deps_rule_names;
    for (std::vector<Edge*>::iterator ne = missing_deps.begin();
         ne != missing_deps.end(); ++ne) {
      for (int i = 0; i < dep_nodes_count; ++i) {
        if (dep_nodes[i]->in_edge() == *ne) {
          generated_nodes_.insert(dep_nodes[i]);
          generator_rules_.insert(&(*ne)->rule());
          missing_deps_rule_names.insert((*ne)->rule().name());
          delegate_->OnMissingDep(node, dep_nodes[i]->path(), (*ne)->rule());
        }
      }
    }
    missing_dep_path_count_ += missing_deps_rule_names.size();
    nodes_missing_deps_.insert(node);
  }
}